

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON__UINT32 MappingCRC(ON_Object *pMappingPrimitive)

{
  bool bVar1;
  int iVar2;
  ON_Mesh *this;
  ON_2fPoint *p_00;
  ON_Brep *pOVar3;
  ON_Surface *pOVar4;
  ON_Surface *p_2;
  ON_Brep *p_1;
  ON_2fPoint *tex;
  ON__UINT32 crc32;
  ON_Mesh *p;
  ON__UINT32 crc32_in;
  ON_Object *pMappingPrimitive_local;
  
  this = ON_Mesh::Cast(pMappingPrimitive);
  if (this == (ON_Mesh *)0x0) {
    pOVar3 = ON_Brep::Cast(pMappingPrimitive);
    if (pOVar3 == (ON_Brep *)0x0) {
      pOVar4 = ON_Surface::Cast(pMappingPrimitive);
      if (pOVar4 == (ON_Surface *)0x0) {
        pMappingPrimitive_local._4_4_ = 0x12341234;
      }
      else {
        pMappingPrimitive_local._4_4_ =
             (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[9])(pOVar4,0x12341234);
      }
    }
    else {
      pMappingPrimitive_local._4_4_ =
           (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[9])(pOVar3,0x12341234);
    }
  }
  else {
    tex._4_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[9])(this,0x12341234);
    bVar1 = ON_Mesh::HasTextureCoordinates(this);
    if (bVar1) {
      p_00 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      iVar2 = ON_SimpleArray<ON_2fPoint>::Count(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      tex._4_4_ = ON_CRC32(tex._4_4_,(long)iVar2 << 3,p_00);
    }
    pMappingPrimitive_local._4_4_ = ON_CRC32(tex._4_4_,0x18,&ON_3dPoint::UnsetPoint);
  }
  return pMappingPrimitive_local._4_4_;
}

Assistant:

static ON__UINT32 MappingCRC(const ON_Object* pMappingPrimitive)
{
  const ON__UINT32 crc32_in = 0x12341234;

  if (const auto* p = ON_Mesh::Cast(pMappingPrimitive))
  {
    ON__UINT32 crc32 =  p->DataCRC(crc32_in);

    if (p->HasTextureCoordinates())
    {
      // 25 August 2010 Dale Lear
      //   Including m_T[] in crc32 per Jussi and Andy email discussion.
      //   This is probably correct because users will expect the
      //   "picture" on the mesh to be applied to the target in
      //   a visual way.
      const ON_2fPoint* tex = p->m_T.Array();
      crc32 = ON_CRC32(crc32, p->m_T.Count() * sizeof(tex[0]), tex);
    }
    // January 7th 2021 Jussi
    //   Added crc of origin to change the mapping crc to tricker re-mapping
    //   of custom mesh mapped objects. This is to make the improvements to
    //   CMeshClosestPointMapper::MatchFaceTC effective on existing models.
    crc32 = ON_CRC32(crc32, sizeof(ON_3dPoint), &ON_3dPoint::UnsetPoint);

    return crc32;
  }

  if (const auto* p = ON_Brep::Cast(pMappingPrimitive))
  {
    return p->DataCRC(crc32_in);
    // 25 August 2010 Dale Lear
    //   Should brep's render meshes be included in the crc?
    //   The texture that is being mapped is actually
    //   being applied to the brep by the render mesh's
    //   m_T[] values and some users will want to see
    //   the "picture" on the brep mapped to the
    //   "picture" on the
    //   target.
  }

  if (const auto* p = ON_Surface::Cast(pMappingPrimitive))
  {
    return p->DataCRC(crc32_in);
  }

  return crc32_in;
}